

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O2

void __thiscall
chrono::ChClassRegistration<chrono::ChSolverMINRES>::~ChClassRegistration
          (ChClassRegistration<chrono::ChSolverMINRES> *this)

{
  ~ChClassRegistration(this);
  ::operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~ChClassRegistration() {

        // register in global class factory
        ChClassFactory::ClassUnregister(this->m_sTagName);
    }